

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLgraph.c
# Opt level: O2

uint RDL_addUEdge_g(RDL_graph *gra,uint from,uint to)

{
  RDL_edge *paRVar1;
  uint **ppuVar2;
  RDL_edge **ppaRVar3;
  ulong uVar4;
  uint *puVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  uint **local_38;
  
  uVar4 = (ulong)from;
  if (from < gra->V && to < gra->V) {
    if (from != to) {
      uVar6 = 0;
      do {
        if (gra->degree[uVar4] == uVar6) {
          RDL_addEdge(gra,from,to);
          RDL_addEdge(gra,to,from);
          uVar8 = gra->E - 1;
          gra->E = uVar8;
          if (uVar8 == gra->edgesAlloced) {
            gra->edgesAlloced = uVar8 * 2;
            local_38 = (uint **)realloc(gra->edges,(ulong)(uVar8 * 2) << 3);
            gra->edges = local_38;
            uVar8 = gra->E;
          }
          else {
            local_38 = gra->edges;
          }
          uVar7 = to;
          if (from < to) {
            uVar7 = from;
          }
          if (from <= to) {
            from = to;
          }
          puVar5 = (uint *)malloc(8);
          local_38[uVar8 - 1] = puVar5;
          ppuVar2 = gra->edges;
          *ppuVar2[uVar8 - 1] = uVar7;
          ppuVar2[gra->E - 1][1] = from;
          uVar8 = gra->E - 1;
          ppaRVar3 = gra->adjList;
          puVar5 = gra->degree;
          ppaRVar3[uVar4][puVar5[uVar4] - 1][1] = uVar8;
          ppaRVar3[to][puVar5[to] - 1][1] = uVar8;
          return uVar8;
        }
        paRVar1 = gra->adjList[uVar4] + uVar6;
        uVar6 = uVar6 + 1;
      } while ((*paRVar1)[0] != to);
      puVar5 = &RDL_DUPLICATE_EDGE;
      goto LAB_0010676b;
    }
    (*RDL_outputFunc)(RDL_WARNING,"Adding a loop is not allowed, node %u\n",uVar4);
  }
  else {
    (*RDL_outputFunc)(RDL_ERROR,"Tried to add an edge with atoms not in range.\n");
    (*RDL_outputFunc)(RDL_ERROR,"edge (%u,%u) can not be added to graph with %u atoms.\n",uVar4,
                      (ulong)to,(ulong)gra->V);
  }
  puVar5 = &RDL_INVALID_RESULT;
LAB_0010676b:
  return *puVar5;
}

Assistant:

unsigned RDL_addUEdge_g(RDL_graph *gra, unsigned from, unsigned to)
{
  unsigned edge_id, i;

  if(from >= gra->V || to >= gra->V) {
    RDL_outputFunc(RDL_ERROR, "Tried to add an edge with atoms not in range.\n");
    RDL_outputFunc(RDL_ERROR,  "edge (%u,%u) can not be added to graph with %u atoms.\n",
        from, to, gra->V);
    return RDL_INVALID_RESULT;
  }

  if (from == to) {
    RDL_outputFunc(RDL_WARNING, "Adding a loop is not allowed, node %u\n", from);
    return RDL_INVALID_RESULT;
  }

  for(i=0; i<gra->degree[from]; ++i) {
    if(gra->adjList[from][i][0] == to) {
      /*edge already exists*/
      return RDL_DUPLICATE_EDGE;
    }
  }
  RDL_addEdge(gra, from, to);
  RDL_addEdge(gra, to, from);
  --gra->E; /*was incremented twice*/

  edge_id = RDL_addToEdgeArray(gra, from, to);

  gra->adjList[from][gra->degree[from]-1][1] = edge_id;
  gra->adjList[to][gra->degree[to]-1][1] = edge_id;

  return edge_id;
}